

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

int __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
find(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
    ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  bool bVar1;
  int local_48;
  int local_40;
  bool local_39;
  int local_2c;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAStack_28;
  int idx;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *direct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pAStack_28 = this->root;
  local_2c = 0;
  while( true ) {
    local_39 = false;
    if (pAStack_28 !=
        (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      local_39 = std::operator!=(&pAStack_28->value,value);
    }
    if (local_39 == false) break;
    bVar1 = std::operator>(&pAStack_28->value,value);
    if (bVar1) {
      pAStack_28 = pAStack_28->left;
    }
    else {
      if (pAStack_28->left ==
          (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = pAStack_28->left->count;
      }
      local_2c = local_40 + 1 + local_2c;
      pAStack_28 = pAStack_28->right;
    }
  }
  if (pAStack_28 ==
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    if (pAStack_28->left ==
        (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = pAStack_28->left->count;
    }
    this_local._4_4_ = local_2c + local_48;
  }
  return this_local._4_4_;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }